

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O3

Statement *
slang::ast::EventTriggerStatement::fromSyntax
          (Compilation *compilation,EventTriggerStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  Type *this;
  bool bVar1;
  int iVar2;
  Expression *this_00;
  Type *pTVar3;
  undefined4 extraout_var;
  EventTriggerStatement *pEVar4;
  Statement *pSVar5;
  socklen_t extraout_EDX;
  socklen_t extraout_EDX_00;
  socklen_t __len;
  SourceRange sourceRange;
  bool isNonBlocking;
  TimingControl *timing;
  bool local_49;
  TimingControl *local_48;
  SourceRange local_40;
  
  this_00 = Expression::bindLValue
                      (&((syntax->name).ptr)->super_ExpressionSyntax,context,
                       (bitmask<slang::ast::AssignFlags>)0x0);
  bVar1 = Expression::bad(this_00);
  if (!bVar1) {
    this = (this_00->type).ptr;
    pTVar3 = this->canonical;
    __len = extraout_EDX;
    if (pTVar3 == (Type *)0x0) {
      Type::resolveCanonical(this);
      pTVar3 = this->canonical;
      __len = extraout_EDX_00;
    }
    if ((pTVar3->super_Symbol).kind == EventType) {
      local_48 = (TimingControl *)0x0;
      if (syntax->timing != (TimingControlSyntax *)0x0) {
        iVar2 = TimingControl::bind((int)syntax->timing,(sockaddr *)context,__len);
        local_48 = (TimingControl *)CONCAT44(extraout_var,iVar2);
        Statement::StatementContext::observeTiming(stmtCtx,local_48);
      }
      local_49 = (syntax->super_StatementSyntax).super_SyntaxNode.kind ==
                 NonblockingEventTriggerStatement;
      local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      pEVar4 = BumpAllocator::
               emplace<slang::ast::EventTriggerStatement,slang::ast::Expression_const&,slang::ast::TimingControl_const*&,bool&,slang::SourceRange>
                         (&compilation->super_BumpAllocator,this_00,&local_48,&local_49,&local_40);
      return &pEVar4->super_Statement;
    }
    sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)(syntax->name).ptr);
    ASTContext::addDiag(context,(DiagCode)0x310008,sourceRange);
  }
  pSVar5 = Statement::badStmt(compilation,(Statement *)0x0);
  return pSVar5;
}

Assistant:

Statement& EventTriggerStatement::fromSyntax(Compilation& compilation,
                                             const EventTriggerStatementSyntax& syntax,
                                             const ASTContext& context, StatementContext& stmtCtx) {
    auto& target = Expression::bindLValue(*syntax.name, context);
    if (target.bad())
        return badStmt(compilation, nullptr);

    if (!target.type->isEvent()) {
        context.addDiag(diag::NotAnEvent, syntax.name->sourceRange());
        return badStmt(compilation, nullptr);
    }

    const TimingControl* timing = nullptr;
    if (syntax.timing) {
        timing = &TimingControl::bind(*syntax.timing, context);
        stmtCtx.observeTiming(*timing);
    }

    bool isNonBlocking = syntax.kind == SyntaxKind::NonblockingEventTriggerStatement;

    return *compilation.emplace<EventTriggerStatement>(target, timing, isNonBlocking,
                                                       syntax.sourceRange());
}